

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::OnCallRefExpr(Validator *this,CallRefExpr *expr)

{
  bool bVar1;
  Var local_78;
  Enum local_2c;
  Enum local_28;
  Index local_24;
  CallRefExpr *pCStack_20;
  Index function_type_index;
  CallRefExpr *expr_local;
  Validator *this_local;
  
  pCStack_20 = expr;
  expr_local = (CallRefExpr *)this;
  local_28 = (Enum)SharedValidator::OnCallRef
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc,&local_24)
  ;
  Result::operator|=(&this->result_,(Result)local_28);
  local_2c = (this->result_).enum_;
  bVar1 = Succeeded((Result)local_2c);
  if (bVar1) {
    Var::Var(&local_78,local_24,&(pCStack_20->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc);
    Var::operator=(&pCStack_20->function_type_index,&local_78);
    Var::~Var(&local_78);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnCallRefExpr(CallRefExpr* expr) {
  Index function_type_index;
  result_ |= validator_.OnCallRef(expr->loc, &function_type_index);
  if (Succeeded(result_)) {
    expr->function_type_index = Var{function_type_index, expr->loc};
    return Result::Ok;
  }

  return Result::Error;
}